

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

boolean jpeg_start_output(j_decompress_ptr cinfo,int scan_number)

{
  boolean bVar1;
  int in_ESI;
  long *in_RDI;
  j_decompress_ptr in_stack_ffffffffffffffe8;
  int local_c;
  
  if ((*(int *)((long)in_RDI + 0x24) != 0xcf) && (*(int *)((long)in_RDI + 0x24) != 0xcc)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  local_c = in_ESI;
  if (in_ESI < 1) {
    local_c = 1;
  }
  if ((*(int *)(in_RDI[0x48] + 0x24) != 0) && (*(int *)((long)in_RDI + 0xac) < local_c)) {
    local_c = *(int *)((long)in_RDI + 0xac);
  }
  *(int *)((long)in_RDI + 0xb4) = local_c;
  bVar1 = output_pass_setup(in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

GLOBAL(boolean)
jpeg_start_output(j_decompress_ptr cinfo, int scan_number)
{
  if (cinfo->global_state != DSTATE_BUFIMAGE &&
      cinfo->global_state != DSTATE_PRESCAN)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Limit scan number to valid range */
  if (scan_number <= 0)
    scan_number = 1;
  if (cinfo->inputctl->eoi_reached && scan_number > cinfo->input_scan_number)
    scan_number = cinfo->input_scan_number;
  cinfo->output_scan_number = scan_number;
  /* Perform any dummy output passes, and set up for the real pass */
  return output_pass_setup(cinfo);
}